

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O2

QImage * __thiscall QImage::operator=(QImage *this,QImage *image)

{
  QImageData *pQVar1;
  long in_FS_OFFSET;
  QImage local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((image->super_QPaintDevice).painters == 0) {
    pQVar1 = image->d;
    if (pQVar1 != (QImageData *)0x0) {
      LOCK();
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar1 = this->d;
    if (pQVar1 != (QImageData *)0x0) {
      LOCK();
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        pQVar1 = this->d;
        if (pQVar1 != (QImageData *)0x0) {
          QImageData::~QImageData(pQVar1);
        }
        operator_delete(pQVar1,0xa0);
      }
    }
    this->d = image->d;
  }
  else {
    copy(&local_38,(QRect *)image);
    operator=(this,&local_38);
    ~QImage(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QImage &QImage::operator=(const QImage &image)
{
    if (image.paintingActive()) {
        operator=(image.copy());
    } else {
        if (image.d)
            image.d->ref.ref();
        if (d && !d->ref.deref())
            delete d;
        d = image.d;
    }
    return *this;
}